

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tutorial.cpp
# Opt level: O2

void __thiscall
LibraryBook::LibraryBook
          (LibraryBook *this,string *title_,string *author_,int available_copies_,string *language_,
          int pages_,string *isbn_)

{
  std::__cxx11::string::string((string *)this,(string *)title_);
  std::__cxx11::string::string((string *)&this->author,(string *)author_);
  this->available_copies = available_copies_;
  std::__cxx11::string::string((string *)&this->language,(string *)language_);
  this->pages = pages_;
  std::__cxx11::string::string((string *)&this->isbn,(string *)isbn_);
  return;
}

Assistant:

LibraryBook(std::string title_,
                std::string author_,
                int available_copies_,
                std::string language_,
                int pages_,
                std::string isbn_)
        : title(title_)
        , author(author_)
        , available_copies(available_copies_)
        , language(language_)
        , pages(pages_)
        , isbn(isbn_)
    {
    }